

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::rotate(PtexSeparableKernel *this,int rotVal)

{
  switch(rotVal & 3) {
  case 0:
    goto switchD_0011d348_caseD_0;
  case 1:
    flipU(this);
    break;
  case 2:
    flipU(this);
    flipV(this);
    goto LAB_0011d376;
  case 3:
    flipV(this);
  }
  swapUV(this);
LAB_0011d376:
  this->rot = rotVal + this->rot & 3;
switchD_0011d348_caseD_0:
  return;
}

Assistant:

void rotate(int rotVal)
    {
        // rotate kernel 'rot' steps ccw
        switch (rotVal & 3) {
        default: return;
        case 1: flipU(); swapUV(); break;
        case 2: flipU(); flipV(); break;
        case 3: flipV(); swapUV(); break;
        }
        rot = (rot + rotVal)&3;
    }